

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  MessageType t;
  bool bVar5;
  TargetType TVar6;
  PolicyStatus PVar7;
  cmMakefile *pcVar8;
  ostream *poVar9;
  string *psVar10;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar11;
  char *pcVar12;
  size_type sVar13;
  cmake *this_01;
  reference pbVar14;
  PolicyID id;
  PolicyID id_00;
  bool local_9b9;
  string *dc_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_968;
  reference local_948;
  string *dc;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  undefined1 local_8e8 [4];
  PolicyStatus policy22Status;
  allocator<char> local_8c1;
  string local_8c0;
  allocator<char> local_899;
  string local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  undefined1 local_838 [8];
  string configLib;
  string local_7f8;
  undefined1 local_7d8 [8];
  ostringstream w;
  string local_660;
  undefined1 local_640 [8];
  ostringstream e_2;
  cmTarget *tgt;
  undefined1 local_4a0 [8];
  ostringstream e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  cmDirectoryId dirId;
  string libRef;
  undefined1 local_2a0;
  bool encodeRemoteReference;
  bool rejectRemoteLinking;
  bool warnRemoteInterface;
  char *local_280;
  char *existingSig;
  MessageType local_254;
  char *pcStack_250;
  MessageType messageType;
  char *modal;
  ostringstream e;
  cmListFileContext local_d0;
  TLLSignature local_88;
  allocator<char> local_81;
  TLLSignature sig;
  allocator<char> local_49;
  string local_48;
  cmTargetLinkLibraryType local_24;
  string *psStack_20;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  cmTargetLinkLibrariesCommand *this_local;
  
  local_24 = llt;
  psStack_20 = lib;
  lib_local = (string *)this;
  TVar6 = cmTarget::GetType(this->Target);
  if ((TVar6 == INTERFACE_LIBRARY) &&
     (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
    pcVar2 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,&local_49);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_0035994d;
  }
  bVar5 = cmTarget::IsImported(this->Target);
  if ((bVar5) && (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
    pcVar2 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sig,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,&local_81);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&sig);
    std::__cxx11::string::~string((string *)&sig);
    std::allocator<char>::~allocator(&local_81);
    this_local._7_1_ = 0;
    goto LAB_0035994d;
  }
  local_9b9 = true;
  if ((((this->CurrentProcessingState != ProcessingPlainPrivateInterface) &&
       (local_9b9 = true, this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
      (local_9b9 = true, this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
     (local_9b9 = true, this->CurrentProcessingState != ProcessingKeywordPublicInterface)) {
    local_9b9 = this->CurrentProcessingState == ProcessingKeywordLinkInterface;
  }
  pcVar11 = this->Target;
  local_88 = (byte)~local_9b9 & PlainTLLSignature;
  cmMakefile::GetExecutionContext(&local_d0,(this->super_cmCommand).Makefile);
  bVar5 = cmTarget::PushTLLCommandTrace(pcVar11,(byte)~local_9b9 & PlainTLLSignature,&local_d0);
  cmListFileContext::~cmListFileContext(&local_d0);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_250 = (char *)0x0;
    local_254 = AUTHOR_WARNING;
    PVar7 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023,false);
    if (PVar7 != OLD) {
      if (PVar7 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&existingSig,(cmPolicies *)0x17,id);
        poVar9 = std::operator<<((ostream *)&modal,(string *)&existingSig);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&existingSig);
        pcStack_250 = "should";
      }
      else if (PVar7 - NEW < 3) {
        pcStack_250 = "must";
        local_254 = FATAL_ERROR;
      }
    }
    if (pcStack_250 == (char *)0x0) {
LAB_00358a6b:
      bVar5 = false;
    }
    else {
      local_280 = "keyword";
      if (local_88 == KeywordTLLSignature) {
        local_280 = "plain";
      }
      poVar9 = std::operator<<((ostream *)&modal,"The ");
      poVar9 = std::operator<<(poVar9,local_280);
      poVar9 = std::operator<<(poVar9,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      psVar10 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      poVar9 = std::operator<<(poVar9,"\".  All uses of target_link_libraries with a target ");
      poVar9 = std::operator<<(poVar9,pcStack_250);
      std::operator<<(poVar9," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces
                (this->Target,(ostream *)&modal,(uint)(local_88 == KeywordTLLSignature));
      t = local_254;
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,t,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      if (local_254 != FATAL_ERROR) goto LAB_00358a6b;
      this_local._7_1_ = 0;
      bVar5 = true;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    if (bVar5) goto LAB_0035994d;
  }
  bVar4 = false;
  bVar3 = false;
  bVar5 = false;
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar8 = cmTarget::GetMakefile(this->Target);
  if (pcVar2 != pcVar8) {
    PVar7 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0079,false);
    if (PVar7 != OLD) {
      if (PVar7 != WARN) {
        if (PVar7 - NEW < 3) {
          bVar5 = true;
        }
        goto LAB_00358b3f;
      }
      bVar4 = true;
    }
    bVar3 = true;
  }
LAB_00358b3f:
  std::__cxx11::string::string((string *)(dirId.String.field_2._M_local_buf + 8));
  if ((!bVar5) || (bVar5 = cmsys::SystemTools::FileIsFullPath(psStack_20), bVar5)) {
    std::__cxx11::string::operator=
              ((string *)(dirId.String.field_2._M_local_buf + 8),(string *)psStack_20);
  }
  else {
    cmMakefile::GetDirectoryId((cmDirectoryId *)local_2e8,(this->super_cmCommand).Makefile);
    std::operator+(&local_328,psStack_20,"::@");
    std::operator+(&local_308,&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    std::__cxx11::string::operator=
              ((string *)(dirId.String.field_2._M_local_buf + 8),(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    cmDirectoryId::~cmDirectoryId((cmDirectoryId *)local_2e8);
  }
  if ((this->CurrentProcessingState == ProcessingKeywordLinkInterface) ||
     (this->CurrentProcessingState == ProcessingPlainLinkInterface)) {
LAB_00359087:
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7d8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_7f8,(cmPolicies *)0x4f,id_00);
      poVar9 = std::operator<<((ostream *)local_7d8,(string *)&local_7f8);
      poVar9 = std::operator<<(poVar9,"\nTarget\n  ");
      psVar10 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      poVar9 = std::operator<<(poVar9,
                               "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
                              );
      poVar9 = std::operator<<(poVar9,(string *)psStack_20);
      std::operator<<(poVar9,
                      "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
                     );
      std::__cxx11::string::~string((string *)&local_7f8);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)((long)&configLib.field_2 + 8));
      std::__cxx11::string::~string((string *)(configLib.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7d8);
    }
    if ((this->CurrentProcessingState == ProcessingKeywordPrivateInterface) ||
       (this->CurrentProcessingState == ProcessingPlainPrivateInterface)) {
      TVar6 = cmTarget::GetType(this->Target);
      if ((TVar6 == STATIC_LIBRARY) ||
         (TVar6 = cmTarget::GetType(this->Target), TVar6 == OBJECT_LIBRARY)) {
        cmTarget::GetDebugGeneratorExpressions
                  ((string *)local_838,this->Target,(string *)((long)&dirId.String.field_2 + 8),
                   local_24);
        bVar5 = cmGeneratorExpression::IsValidTargetName
                          ((string *)((long)&dirId.String.field_2 + 8));
        if ((bVar5) ||
           (sVar13 = cmGeneratorExpression::Find((string *)((long)&dirId.String.field_2 + 8)),
           sVar13 != 0xffffffffffffffff)) {
          std::operator+(&local_878,"$<LINK_ONLY:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_838);
          std::operator+(&local_858,&local_878,">");
          std::__cxx11::string::operator=((string *)local_838,(string *)&local_858);
          std::__cxx11::string::~string((string *)&local_858);
          std::__cxx11::string::~string((string *)&local_878);
        }
        pcVar11 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_898,"INTERFACE_LINK_LIBRARIES",&local_899);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        cmTarget::AppendProperty(pcVar11,&local_898,pcVar12,false);
        std::__cxx11::string::~string((string *)&local_898);
        std::allocator<char>::~allocator(&local_899);
        std::__cxx11::string::~string((string *)local_838);
      }
      this_local._7_1_ = 1;
    }
    else {
      pcVar11 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c0,"INTERFACE_LINK_LIBRARIES",&local_8c1);
      cmTarget::GetDebugGeneratorExpressions
                ((string *)local_8e8,this->Target,(string *)((long)&dirId.String.field_2 + 8),
                 local_24);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      cmTarget::AppendProperty(pcVar11,&local_8c0,pcVar12,false);
      std::__cxx11::string::~string((string *)local_8e8);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::allocator<char>::~allocator(&local_8c1);
      if (this->CurrentProcessingState == ProcessingLinkLibraries) {
        this_local._7_1_ = 1;
      }
      else {
        PVar7 = cmTarget::GetPolicyStatusCMP0022(this->Target);
        if ((PVar7 == OLD) || (PVar7 == WARN)) {
          TVar6 = cmTarget::GetType(this->Target);
          if (TVar6 == INTERFACE_LIBRARY) {
            this_local._7_1_ = 1;
          }
          else {
            this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
            cmake::GetDebugConfigs_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&prop.field_2 + 8),this_01);
            std::__cxx11::string::string((string *)&__range2);
            if ((local_24 == DEBUG_LibraryType) || (local_24 == GENERAL_LibraryType)) {
              pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&prop.field_2 + 8);
              __end2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(pvVar1);
              dc = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(pvVar1);
              while (bVar5 = __gnu_cxx::operator!=
                                       (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&dc), bVar5) {
                local_948 = __gnu_cxx::
                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&__end2);
                std::__cxx11::string::operator=((string *)&__range2,"LINK_INTERFACE_LIBRARIES_");
                std::__cxx11::string::operator+=((string *)&__range2,(string *)local_948);
                pcVar11 = this->Target;
                pcVar12 = (char *)std::__cxx11::string::c_str();
                cmTarget::AppendProperty(pcVar11,(string *)&__range2,pcVar12,false);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end2);
              }
            }
            if ((local_24 == OPTIMIZED_LibraryType) || (local_24 == GENERAL_LibraryType)) {
              pcVar11 = this->Target;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_968,"LINK_INTERFACE_LIBRARIES",
                         (allocator<char> *)((long)&__range2_1 + 7));
              pcVar12 = (char *)std::__cxx11::string::c_str();
              cmTarget::AppendProperty(pcVar11,&local_968,pcVar12,false);
              std::__cxx11::string::~string((string *)&local_968);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
              pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&prop.field_2 + 8);
              __end2_1 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(pvVar1);
              dc_1 = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(pvVar1);
              while (bVar5 = __gnu_cxx::operator!=
                                       (&__end2_1,
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&dc_1), bVar5) {
                pbVar14 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end2_1);
                std::__cxx11::string::operator=((string *)&__range2,"LINK_INTERFACE_LIBRARIES_");
                std::__cxx11::string::operator+=((string *)&__range2,(string *)pbVar14);
                pcVar12 = cmTarget::GetProperty(this->Target,(string *)&__range2);
                if (pcVar12 == (char *)0x0) {
                  cmTarget::SetProperty(this->Target,(string *)&__range2,"");
                }
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end2_1);
              }
            }
            std::__cxx11::string::~string((string *)&__range2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&prop.field_2 + 8));
            this_local._7_1_ = 1;
          }
        }
        else {
          this_local._7_1_ = 1;
        }
      }
    }
  }
  else {
    if (!bVar3) {
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pcVar11 = cmGlobalGenerator::FindTarget(this_00,psStack_20,false);
      if ((((pcVar11 != (cmTarget *)0x0) &&
           (TVar6 = cmTarget::GetType(pcVar11), TVar6 != STATIC_LIBRARY)) &&
          (TVar6 = cmTarget::GetType(pcVar11), TVar6 != SHARED_LIBRARY)) &&
         (((TVar6 = cmTarget::GetType(pcVar11), TVar6 != UNKNOWN_LIBRARY &&
           (TVar6 = cmTarget::GetType(pcVar11), TVar6 != OBJECT_LIBRARY)) &&
          ((TVar6 = cmTarget::GetType(pcVar11), TVar6 != INTERFACE_LIBRARY &&
           (bVar5 = cmTarget::IsExecutableWithExports(pcVar11), !bVar5)))))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
        poVar9 = std::operator<<((ostream *)local_640,"Target \"");
        poVar9 = std::operator<<(poVar9,(string *)psStack_20);
        poVar9 = std::operator<<(poVar9,"\" of type ");
        TVar6 = cmTarget::GetType(pcVar11);
        pcVar12 = cmState::GetTargetTypeName(TVar6);
        poVar9 = std::operator<<(poVar9,pcVar12);
        std::operator<<(poVar9,
                        " may not be linked into another target.  One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables with the ENABLE_EXPORTS property set."
                       );
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_660);
        std::__cxx11::string::~string((string *)&local_660);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
      }
      cmTarget::AddLinkLibrary
                (this->Target,(this->super_cmCommand).Makefile,psStack_20,
                 (string *)((long)&dirId.String.field_2 + 8),local_24);
      goto LAB_00359087;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0);
    poVar9 = std::operator<<((ostream *)local_4a0,"Attempt to add link library \"");
    poVar9 = std::operator<<(poVar9,(string *)psStack_20);
    poVar9 = std::operator<<(poVar9,"\" to target \"");
    psVar10 = cmTarget::GetName_abi_cxx11_(this->Target);
    poVar9 = std::operator<<(poVar9,(string *)psVar10);
    poVar9 = std::operator<<(poVar9,"\" which is not built in this directory.\n");
    std::operator<<(poVar9,"This is allowed only when policy CMP0079 is set to NEW.");
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&tgt);
    std::__cxx11::string::~string((string *)&tgt);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
  }
  std::__cxx11::string::~string((string *)(dirId.String.field_2._M_local_buf + 8));
LAB_0035994d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                                 cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (this->CurrentProcessingState == ProcessingPlainPrivateInterface ||
     this->CurrentProcessingState == ProcessingPlainPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
     this->CurrentProcessingState == ProcessingKeywordPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  bool warnRemoteInterface = false;
  bool rejectRemoteLinking = false;
  bool encodeRemoteReference = false;
  if (this->Makefile != this->Target->GetMakefile()) {
    // The LHS target was created in another directory.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0079)) {
      case cmPolicies::WARN:
        warnRemoteInterface = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        rejectRemoteLinking = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        encodeRemoteReference = true;
        break;
    }
  }

  std::string libRef;
  if (encodeRemoteReference && !cmSystemTools::FileIsFullPath(lib)) {
    // This is a library name added by a caller that is not in the
    // same directory as the target was created.  Add a suffix to
    // the name to tell ResolveLinkItem to look up the name in the
    // caller's directory.
    cmDirectoryId const dirId = this->Makefile->GetDirectoryId();
    libRef = lib + CMAKE_DIRECTORY_ID_SEP + dirId.String;
  } else {
    // This is an absolute path or a library name added by a caller
    // in the same directory as the target was created.  We can use
    // the original name directly.
    libRef = lib;
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->CurrentProcessingState != ProcessingPlainLinkInterface) {

    if (rejectRemoteLinking) {
      std::ostringstream e;
      e << "Attempt to add link library \"" << lib << "\" to target \""
        << this->Target->GetName()
        << "\" which is not built in this directory.\n"
        << "This is allowed only when policy CMP0079 is set to NEW.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }

    cmTarget* tgt = this->Makefile->GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      std::ostringstream e;
      e << "Target \"" << lib << "\" of type "
        << cmState::GetTargetTypeName(tgt->GetType())
        << " may not be linked into another target.  One may link only to "
           "INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables "
           "with the ENABLE_EXPORTS property set.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }

    this->Target->AddLinkLibrary(*this->Makefile, lib, libRef, llt);
  }

  if (warnRemoteInterface) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0079) << "\n"
      "Target\n  " << this->Target->GetName() << "\nis not created in this "
      "directory.  For compatibility with older versions of CMake, link "
      "library\n  " << lib << "\nwill be looked up in the directory in "
      "which the target was created rather than in this calling "
      "directory.";
    /* clang-format on */
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
      this->CurrentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(libRef, llt);
      if (cmGeneratorExpression::IsValidTargetName(libRef) ||
          cmGeneratorExpression::Find(libRef) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                   configLib.c_str());
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->Target->AppendProperty(
    "INTERFACE_LINK_LIBRARIES",
    this->Target->GetDebugGeneratorExpressions(libRef, llt).c_str());

  // Stop processing if called without any keyword.
  if (this->CurrentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile->GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        this->Target->AppendProperty(prop, libRef.c_str());
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", libRef.c_str());

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}